

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O2

const_pointer __thiscall
boost::numeric::ublas::
compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::find_element(compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *this,size_type i)

{
  unsigned_long *puVar1;
  const_pointer pdVar2;
  
  puVar1 = detail::lower_bound<unsigned_long_const*,unsigned_long,std::less<unsigned_long>>();
  if ((puVar1 == (unsigned_long *)(*(long *)(this + 0x28) + *(long *)(this + 0x10) * 8)) ||
     (*puVar1 != i)) {
    pdVar2 = (const_pointer)0x0;
  }
  else {
    pdVar2 = (const_pointer)((long)puVar1 + (*(long *)(this + 0x40) - *(long *)(this + 0x28)));
  }
  return pdVar2;
}

Assistant:

BOOST_UBLAS_INLINE
        const_pointer find_element (size_type i) const {
            const_subiterator_type it (detail::lower_bound (index_data_.begin (), index_data_.begin () + filled_, k_based (i), std::less<size_type> ()));
            if (it == index_data_.begin () + filled_ || *it != k_based (i))
                return 0;
            return &value_data_ [it - index_data_.begin ()];
        }